

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
* __thiscall
spvtools::opt::analysis::ConstantManager::GetOperandConstants
          (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           *__return_storage_ptr__,ConstantManager *this,Instruction *inst)

{
  uint uVar1;
  uint32_t uVar2;
  uint *puVar3;
  Constant *local_48;
  Constant *constant;
  value_type pCStack_38;
  uint32_t id;
  Operand *local_30;
  Operand *operand;
  uint32_t i;
  Instruction *inst_local;
  ConstantManager *this_local;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants;
  
  operand._7_1_ = 0;
  _i = inst;
  inst_local = (Instruction *)this;
  this_local = (ConstantManager *)__return_storage_ptr__;
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::vector(__return_storage_ptr__);
  uVar2 = opt::Instruction::NumInOperands(_i);
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::reserve(__return_storage_ptr__,(ulong)uVar2);
  for (operand._0_4_ = 0; uVar1 = (uint)operand, uVar2 = opt::Instruction::NumInOperands(_i),
      uVar1 < uVar2; operand._0_4_ = (uint)operand + 1) {
    local_30 = opt::Instruction::GetInOperand(_i,(uint)operand);
    if (local_30->type == SPV_OPERAND_TYPE_ID) {
      puVar3 = utils::SmallVector<unsigned_int,_2UL>::operator[](&local_30->words,0);
      constant._4_4_ = *puVar3;
      local_48 = FindDeclaredConstant(this,constant._4_4_);
      std::
      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::push_back(__return_storage_ptr__,&local_48);
    }
    else {
      pCStack_38 = (value_type)0x0;
      std::
      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::push_back(__return_storage_ptr__,&stack0xffffffffffffffc8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Constant*> ConstantManager::GetOperandConstants(
    const Instruction* inst) const {
  std::vector<const Constant*> constants;
  constants.reserve(inst->NumInOperands());
  for (uint32_t i = 0; i < inst->NumInOperands(); i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      constants.push_back(nullptr);
    } else {
      uint32_t id = operand->words[0];
      const analysis::Constant* constant = FindDeclaredConstant(id);
      constants.push_back(constant);
    }
  }
  return constants;
}